

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flops.cc
# Opt level: O2

void runAll(void)

{
  undefined1 local_a0 [32];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT824(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105ab8;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105b08;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105b48;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105b88;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105bc8;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105c08;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105c48;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105c88;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105cc8;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105d08;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105d48;
  bench_kernel((benchmark *)local_a0);
  local_80 = 1.001;
  fStack_7c = 1.001;
  fStack_78 = 1.001;
  fStack_74 = 1.001;
  fStack_70 = 1.001;
  fStack_6c = 1.001;
  fStack_68 = 1.001;
  fStack_64 = 1.001;
  local_60 = 1.002;
  fStack_5c = 1.002;
  fStack_58 = 1.002;
  fStack_54 = 1.002;
  fStack_50 = 1.002;
  fStack_4c = 1.002;
  fStack_48 = 1.002;
  fStack_44 = 1.002;
  local_a0._8_24_ = ZEXT424(0);
  local_a0._0_8_ = &PTR_get_flops_per_iteration_00105d88;
  bench_kernel((benchmark *)local_a0);
  return;
}

Assistant:

void runAll()
{
    bench_kernel(benchmark_1 {});
    bench_kernel(benchmark_2 {});
    bench_kernel(benchmark_3 {});
    bench_kernel(benchmark_4 {});
    bench_kernel(benchmark_5 {});
    bench_kernel(benchmark_6 {});
    bench_kernel(benchmark_7 {});
    bench_kernel(benchmark_8 {});
    bench_kernel(benchmark_9 {});
    bench_kernel(benchmark_10 {});
    bench_kernel(benchmark_11 {});
    bench_kernel(benchmark_12 {});
}